

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_in_place(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  REF_STATUS RVar1;
  uint uVar2;
  int local_dc;
  int local_d8;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL check_volume;
  REF_INT node;
  REF_INT nodes [27];
  int local_24;
  REF_INT cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  for (local_24 = 0; local_24 < ref_grid->cell[6]->max; local_24 = local_24 + 1) {
    RVar1 = ref_cell_nodes(ref_grid->cell[6],local_24,&check_volume);
    if ((RVar1 == 0) &&
       (uVar2 = ref_shard_add_qua_as_tri(ref_node_00,ref_grid->cell[3],&check_volume), uVar2 != 0))
    {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x4a6
             ,"ref_shard_in_place",(ulong)uVar2,"add qua tri");
      return uVar2;
    }
  }
  ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[6]);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 6,REF_CELL_QUA);
    if (ref_grid_local._4_4_ == 0) {
      for (local_24 = 0; local_24 < ref_grid->cell[9]->max; local_24 = local_24 + 1) {
        RVar1 = ref_cell_nodes(ref_grid->cell[9],local_24,&check_volume);
        if ((RVar1 == 0) &&
           (uVar2 = ref_shard_add_pyr_as_tet(ref_node_00,ref_grid->cell[8],&check_volume,0),
           uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x4ae,"ref_shard_in_place",(ulong)uVar2,"add pyr tet");
          return uVar2;
        }
      }
      ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[9]);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
        if (ref_grid_local._4_4_ == 0) {
          for (local_24 = 0; local_24 < ref_grid->cell[10]->max; local_24 = local_24 + 1) {
            RVar1 = ref_cell_nodes(ref_grid->cell[10],local_24,&check_volume);
            if ((RVar1 == 0) &&
               (uVar2 = ref_shard_add_pri_as_tet(ref_node_00,ref_grid->cell[8],&check_volume,0),
               uVar2 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x4b6,"ref_shard_in_place",(ulong)uVar2,"add pri tet");
              return uVar2;
            }
          }
          ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[10]);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
            if (ref_grid_local._4_4_ == 0) {
              for (local_24 = 0; local_24 < ref_grid->cell[0xb]->max; local_24 = local_24 + 1) {
                RVar1 = ref_cell_nodes(ref_grid->cell[0xb],local_24,&check_volume);
                if ((RVar1 == 0) &&
                   (uVar2 = ref_shard_add_hex_as_tet(ref_node_00,ref_grid->cell[8],&check_volume),
                   uVar2 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x4bd,"ref_shard_in_place",(ulong)uVar2,"add hex tet");
                  return uVar2;
                }
              }
              ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[0xb]);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (ref_grid_local._4_4_ == 0) {
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node_00->max
                      ; ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    if (((-1 < ref_private_macro_code_rss) &&
                        (ref_private_macro_code_rss < ref_node_00->max)) &&
                       (-1 < ref_node_00->global[ref_private_macro_code_rss])) {
                      if ((ref_private_macro_code_rss < 0) ||
                         (ref_grid->cell[3]->ref_adj->nnode <= ref_private_macro_code_rss)) {
                        local_d8 = -1;
                      }
                      else {
                        local_d8 = ref_grid->cell[3]->ref_adj->first[ref_private_macro_code_rss];
                      }
                      if (local_d8 == -1) {
                        if ((ref_private_macro_code_rss < 0) ||
                           (ref_grid->cell[8]->ref_adj->nnode <= ref_private_macro_code_rss)) {
                          local_dc = -1;
                        }
                        else {
                          local_dc = ref_grid->cell[8]->ref_adj->first[ref_private_macro_code_rss];
                        }
                        if ((local_dc == -1) &&
                           (uVar2 = ref_node_remove_without_global
                                              (ref_node_00,ref_private_macro_code_rss), uVar2 != 0))
                        {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                                 ,0x4c5,"ref_shard_in_place",(ulong)uVar2,"hanging node");
                          return uVar2;
                        }
                      }
                    }
                  }
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x4c0,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"hex create");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x4bf,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"free hex");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x4b9,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"pri create");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x4b8,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"free pri");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x4b1,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"pyr create");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x4b0,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"free pyr");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x4a9
             ,"ref_shard_in_place",(ulong)ref_grid_local._4_4_,"qua create");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x4a8,
           "ref_shard_in_place",(ulong)ref_grid_local._4_4_,"free qua");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_shard_in_place(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL check_volume = REF_FALSE;

  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell, nodes) {
    RSS(ref_shard_add_qua_as_tri(ref_node, ref_grid_tri(ref_grid), nodes),
        "add qua tri");
  }
  RSS(ref_cell_free(ref_grid_qua(ref_grid)), "free qua");
  RSS(ref_cell_create(&ref_grid_qua(ref_grid), REF_CELL_QUA), "qua create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pyr tet");
  }
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "free pyr");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pri tet");
  }
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "free pri");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_node, ref_grid_tet(ref_grid), nodes),
        "add hex tet");
  }
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "free hex");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hanging node");
    }
  }

  return REF_SUCCESS;
}